

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

uint64_t fdb_set_file_header(fdb_kvs_handle *handle,bool inc_revnum)

{
  fdb_seqtree_opt_t fVar1;
  crc_mode_e mode;
  filemgr *pfVar2;
  filemgr_magic_t fVar3;
  char *__s;
  char *__s_00;
  long lVar4;
  bool bVar5;
  ushort uVar6;
  ushort uVar7;
  uint32_t uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  uint64_t uVar12;
  uint uVar13;
  long lVar14;
  size_t buf_len;
  uint uVar15;
  uint8_t *buf;
  ulong uStack_90;
  undefined1 local_88 [8];
  kvs_stat stat;
  
  uVar9 = (ulong)(handle->config).blocksize + 0xf & 0xfffffffffffffff0;
  lVar4 = -uVar9;
  buf = local_88 + lVar4;
  uVar10 = handle->trie->root_bid;
  pfVar2 = handle->file;
  *(ulong *)(local_88 + -uVar9) =
       uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18 |
       (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
       (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
  if ((handle->config).seqtree_opt == '\x01') {
    uVar10 = ((handle->field_6).seqtree)->root_bid;
    uVar10 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
             (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
             (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28 |
             uVar10 << 0x38;
  }
  else {
    *(undefined8 *)((long)&uStack_90 + lVar4) = 0xffffffffffffffff;
    uVar10 = *(ulong *)((long)&uStack_90 + lVar4);
  }
  *(ulong *)((long)&stat + lVar4) = uVar10;
  fVar3 = pfVar2->version;
  *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11d65f;
  bVar5 = ver_staletree_support(fVar3);
  if (bVar5) {
    uVar10 = handle->staletree->root_bid;
    *(ulong *)((long)&stat + lVar4 + 8) =
         uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18 |
         (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
         (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
    *(undefined8 *)((long)&uStack_90 + lVar4) = 0x18;
  }
  else {
    *(undefined8 *)((long)&uStack_90 + lVar4) = 0x10;
  }
  lVar14 = *(long *)((long)&uStack_90 + lVar4);
  *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11d68b;
  _kvs_stat_get(pfVar2,0,(kvs_stat *)local_88);
  *(uint64_t *)(buf + lVar14) =
       stat.nlivenodes >> 0x38 | (stat.nlivenodes & 0xff000000000000) >> 0x28 |
       (stat.nlivenodes & 0xff0000000000) >> 0x18 | (stat.nlivenodes & 0xff00000000) >> 8 |
       (stat.nlivenodes & 0xff000000) << 8 | (stat.nlivenodes & 0xff0000) << 0x18 |
       (stat.nlivenodes & 0xff00) << 0x28 | stat.nlivenodes << 0x38;
  fVar3 = handle->file->version;
  *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11d6a6;
  bVar5 = ver_is_atleast_magic_001(fVar3);
  if (bVar5) {
    *(uint64_t *)((long)&stat + lVar14 + lVar4) =
         stat.ndocs >> 0x38 | (stat.ndocs & 0xff000000000000) >> 0x28 |
         (stat.ndocs & 0xff0000000000) >> 0x18 | (stat.ndocs & 0xff00000000) >> 8 |
         (stat.ndocs & 0xff000000) << 8 | (stat.ndocs & 0xff0000) << 0x18 |
         (stat.ndocs & 0xff00) << 0x28 | stat.ndocs << 0x38;
    lVar14 = lVar14 + 0x10;
  }
  else {
    lVar14 = lVar14 + 8;
  }
  *(ulong *)(buf + lVar14) =
       (ulong)local_88 >> 0x38 | ((ulong)local_88 & 0xff000000000000) >> 0x28 |
       ((ulong)local_88 & 0xff0000000000) >> 0x18 | ((ulong)local_88 & 0xff00000000) >> 8 |
       ((ulong)local_88 & 0xff000000) << 8 | ((ulong)local_88 & 0xff0000) << 0x18 |
       ((ulong)local_88 & 0xff00) << 0x28 | (long)local_88 << 0x38;
  *(uint64_t *)((long)&stat + lVar14 + lVar4) =
       stat.ndeletes >> 0x38 | (stat.ndeletes & 0xff000000000000) >> 0x28 |
       (stat.ndeletes & 0xff0000000000) >> 0x18 | (stat.ndeletes & 0xff00000000) >> 8 |
       (stat.ndeletes & 0xff000000) << 8 | (stat.ndeletes & 0xff0000) << 0x18 |
       (stat.ndeletes & 0xff00) << 0x28 | stat.ndeletes << 0x38;
  uVar10 = handle->last_wal_flush_hdr_bid;
  *(ulong *)((long)&stat + lVar14 + lVar4 + 8) =
       uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18 |
       (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
       (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
  uVar10 = handle->kv_info_offset;
  *(ulong *)((long)&stat + lVar14 + lVar4 + 0x10) =
       uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18 |
       (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
       (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
  fVar1 = (handle->config).seqtree_opt;
  pfVar2 = handle->file;
  uVar12 = handle->fhandle->flags;
  *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11d717;
  bVar5 = filemgr_is_successfully_compacted(pfVar2);
  uVar9 = (ulong)((uint)(fVar1 == '\x01') | (uint)uVar12 & 6) << 0x38;
  uVar10 = uVar9 | 0x800000000000000;
  if (!bVar5) {
    uVar10 = uVar9;
  }
  *(ulong *)((long)&stat + lVar14 + lVar4 + 0x18) = uVar10;
  pfVar2 = handle->file;
  __s = pfVar2->new_filename;
  if (__s == (char *)0x0) {
    uVar15 = 0;
  }
  else {
    *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11d747;
    sVar11 = strlen(__s);
    uVar15 = (int)sVar11 + 1;
  }
  uVar6 = (ushort)uVar15;
  *(ushort *)((long)&stat + lVar14 + lVar4 + 0x20) = uVar6 << 8 | uVar6 >> 8;
  __s_00 = pfVar2->old_filename;
  stat.deltasize = (int64_t)pfVar2;
  if (__s_00 == (char *)0x0) {
    uVar13 = 0;
  }
  else {
    *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11d778;
    sVar11 = strlen(__s_00);
    uVar13 = (int)sVar11 + 1;
  }
  uVar7 = (ushort)uVar13;
  *(ushort *)((long)&stat + lVar14 + lVar4 + 0x22) = uVar7 << 8 | uVar7 >> 8;
  buf_len = lVar14 + 0x2c;
  if (uVar6 != 0) {
    *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11d7ab;
    memcpy(buf + buf_len,__s,(ulong)(uVar15 & 0xffff));
    buf_len = buf_len + (uVar15 & 0xffff);
  }
  if (uVar7 != 0) {
    *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11d7c6;
    memcpy(buf + buf_len,__s_00,(ulong)(uVar13 & 0xffff));
    buf_len = buf_len + (uVar13 & 0xffff);
  }
  mode = *(crc_mode_e *)(stat.deltasize + 0x228);
  *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11d7de;
  uVar8 = get_checksum(buf,buf_len,mode);
  *(uint32_t *)(buf + buf_len) =
       uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  pfVar2 = handle->file;
  *(undefined8 *)((long)&uStack_90 + lVar4) = 0x11d7fb;
  uVar12 = filemgr_update_header(pfVar2,buf,buf_len + 4,inc_revnum);
  return uVar12;
}

Assistant:

uint64_t fdb_set_file_header(fdb_kvs_handle *handle, bool inc_revnum)
{
    /*
    <ForestDB header>
    [offset]: (description)
    [     0]: BID of root node of root B+Tree of HB+Trie: 8 bytes
    [     8]: BID of root node of seq B+Tree: 8 bytes (0xFF.. if not used)
    [    16]: BID of root node of stale block B+Tree: 8 bytes (since V3)
    [    24]: # of live documents: 8 bytes
    [    32]: # of deleted documents: 8 bytes (version specific)
    [    40]: # of live B+Tree nodes: 8 bytes
    [    48]: Data size (byte): 8 bytes
    [    56]: BID of the DB header created when last WAL flush: 8 bytes
    [    64]: Offset of the document containing KV instances' info: 8 bytes
    [    72]: Header flags: 8 bytes
    [    80]: Size of newly compacted target file name : 2 bytes
    [    82]: Size of old file name before compaction :  2 bytes
    [    84]: File name of newly compacted file : x bytes
    [  84+x]: File name of old file before compcation : y bytes
    [84+x+y]: CRC32: 4 bytes
    total size (header's length): 88+x+y bytes

    Note: the list of functions that need to be modified
          if the header structure is changed:

        fdb_fetch_header() and associated callers in forestdb.cc
        ver_get_new_filename_off() in version.cc
        _fdb_redirect_header() in forestdb.cc
        filemgr_destroy_file() in filemgr.cc
        print_header() in dump_common.cc
        decode_dblock() and dblock in forestdb_hexamine.cc
        fdb_get_reusable_block() in staleblock.cc
    */

    uint8_t *buf = alca(uint8_t, handle->config.blocksize);
    uint16_t new_filename_len = 0;
    uint16_t old_filename_len = 0;
    uint16_t _edn_safe_16;
    uint32_t crc;
    uint64_t _edn_safe_64;
    size_t offset = 0;
    struct filemgr *cur_file;
    struct kvs_stat stat;

    cur_file = handle->file;

    // hb+trie or idtree root bid
    _edn_safe_64 = _endian_encode(handle->trie->root_bid);
    seq_memcpy(buf + offset, &_edn_safe_64, sizeof(handle->trie->root_bid), offset);

    if (handle->config.seqtree_opt == FDB_SEQTREE_USE) {
        // b+tree root bid
        _edn_safe_64 = _endian_encode(handle->seqtree->root_bid);
        seq_memcpy(buf + offset, &_edn_safe_64,
            sizeof(handle->seqtree->root_bid), offset);
    } else {
        memset(buf + offset, 0xff, sizeof(uint64_t));
        offset += sizeof(uint64_t);
    }

    // stale block tree root bid (MAGIC_002)
    if (ver_staletree_support(handle->file->version)) {
        _edn_safe_64 = _endian_encode(handle->staletree->root_bid);
        seq_memcpy(buf + offset, &_edn_safe_64,
                   sizeof(handle->staletree->root_bid), offset);
    }

    // get stat
    _kvs_stat_get(cur_file, 0, &stat);

    // # docs
    _edn_safe_64 = _endian_encode(stat.ndocs);
    seq_memcpy(buf + offset, &_edn_safe_64, sizeof(_edn_safe_64), offset);

    // # deleted docs (since MAGIC_001)
    if (ver_is_atleast_magic_001(handle->file->version)) {
        _edn_safe_64 = _endian_encode(stat.ndeletes);
        seq_memcpy(buf + offset, &_edn_safe_64, sizeof(_edn_safe_64), offset);
    }

    // # live nodes
    _edn_safe_64 = _endian_encode(stat.nlivenodes);
    seq_memcpy(buf + offset, &_edn_safe_64,
               sizeof(_edn_safe_64), offset);
    // data size
    _edn_safe_64 = _endian_encode(stat.datasize);
    seq_memcpy(buf + offset, &_edn_safe_64, sizeof(_edn_safe_64), offset);

    // last header bid
    _edn_safe_64 = _endian_encode(handle->last_wal_flush_hdr_bid);
    seq_memcpy(buf + offset, &_edn_safe_64,
               sizeof(handle->last_wal_flush_hdr_bid), offset);
    // kv info offset
    _edn_safe_64 = _endian_encode(handle->kv_info_offset);
    seq_memcpy(buf + offset, &_edn_safe_64,
               sizeof(handle->kv_info_offset), offset);
    // header flags
    _edn_safe_64 = _fdb_export_header_flags(handle);
    _edn_safe_64 = _endian_encode(_edn_safe_64);
    seq_memcpy(buf + offset, &_edn_safe_64,
               sizeof(_edn_safe_64), offset);

    // size of newly compacted target file name
    if (handle->file->new_filename) {
        new_filename_len = strlen(handle->file->new_filename) + 1;
    }
    _edn_safe_16 = _endian_encode(new_filename_len);
    seq_memcpy(buf + offset, &_edn_safe_16, sizeof(new_filename_len), offset);

    // size of old filename before compaction
    if (handle->file->old_filename) {
        old_filename_len = strlen(handle->file->old_filename) + 1;
    }
    _edn_safe_16 = _endian_encode(old_filename_len);
    seq_memcpy(buf + offset, &_edn_safe_16, sizeof(old_filename_len), offset);

    if (new_filename_len) {
        seq_memcpy(buf + offset, handle->file->new_filename,
                   new_filename_len, offset);
    }

    if (old_filename_len) {
        seq_memcpy(buf + offset, handle->file->old_filename,
                   old_filename_len, offset);
    }

    // crc32
    crc = get_checksum(buf, offset, handle->file->crc_mode);
    crc = _endian_encode(crc);
    seq_memcpy(buf + offset, &crc, sizeof(crc), offset);

    return filemgr_update_header(handle->file, buf, offset, inc_revnum);
}